

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void __thiscall DCanvas::~DCanvas(DCanvas *this)

{
  DCanvas **local_20;
  DCanvas **prev;
  DCanvas *probe;
  DCanvas *this_local;
  
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009fd518;
  local_20 = &CanvasChain;
  prev = (DCanvas **)CanvasChain;
  do {
    if (prev == (DCanvas **)0x0) {
LAB_0067171f:
      DObject::~DObject(&this->super_DObject);
      return;
    }
    if ((DCanvas *)prev == this) {
      *local_20 = prev[8];
      goto LAB_0067171f;
    }
    local_20 = prev + 8;
    prev = (DCanvas **)prev[8];
  } while( true );
}

Assistant:

DCanvas::~DCanvas ()
{
	// Remove from list of active canvases
	DCanvas *probe = CanvasChain, **prev;

	prev = &CanvasChain;
	probe = CanvasChain;

	while (probe != NULL)
	{
		if (probe == this)
		{
			*prev = probe->Next;
			break;
		}
		prev = &probe->Next;
		probe = probe->Next;
	}
}